

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

void xm_update_frequency(xm_context_t *ctx,xm_channel_context_t *ch)

{
  xm_frequency_type_t xVar1;
  byte bVar2;
  byte bVar3;
  float unaff_EBP;
  long lVar4;
  uint32_t unaff_R15D;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar8 = ch->period;
  fVar9 = (float)ch->arp_note_offset;
  fVar7 = ch->vibrato_note_offset + ch->autovibrato_note_offset;
  xVar1 = (ctx->module).frequency_type;
  if (xVar1 == XM_AMIGA_FREQUENCIES) {
    if (ch->arp_note_offset == 0) {
      fVar8 = fVar7 * 16.0 + fVar8;
    }
    else {
      fVar8 = fVar8 * 1024.0;
      if (fVar8 <= 1753088.0) {
        bVar2 = 0;
        fVar5 = 876544.0;
        while (fVar8 < fVar5) {
          bVar2 = bVar2 + 1;
          fVar5 = (float)(int)(0xd6000 >> (bVar2 & 0x1f));
        }
      }
      else {
        bVar2 = 0;
        do {
          bVar3 = 1 - bVar2;
          bVar2 = bVar2 - 1;
        } while ((float)(uint)(0x1ac000 << (bVar3 & 0x1f)) < fVar8);
      }
      lVar4 = 1;
      do {
        if (lVar4 == 0xd) {
          fVar10 = (float)(int)unaff_EBP;
          fVar5 = (float)(int)unaff_R15D;
          fVar6 = 0.0;
          goto LAB_00105207;
        }
        unaff_EBP = multi_retrig_add[lVar4 + 0xf];
        unaff_R15D = amiga_frequencies[lVar4];
        if ((char)bVar2 < '\x01') {
          if ((char)bVar2 < '\0') {
            unaff_EBP = (float)((int)unaff_EBP << (-bVar2 & 0x1f));
            unaff_R15D = unaff_R15D << (-bVar2 & 0x1f);
          }
        }
        else {
          unaff_EBP = (float)((int)unaff_EBP >> (bVar2 & 0x1f));
          unaff_R15D = (int)unaff_R15D >> (bVar2 & 0x1f);
        }
        fVar5 = (float)(int)unaff_R15D;
        lVar4 = lVar4 + 1;
      } while ((fVar8 < fVar5) || (fVar10 = (float)(int)unaff_EBP, fVar10 < fVar8));
      fVar6 = (float)(int)(char)((char)lVar4 + -2);
LAB_00105207:
      if ((fVar8 < fVar5) || (fVar10 < fVar8)) {
        fprintf(_stderr,"%s(): %d <= %f <= %d should hold but doesn\'t, this is a bug\n",
                (double)fVar8,"xm_frequency",(ulong)unaff_R15D,(ulong)(uint)unaff_EBP);
        fflush(_stderr);
      }
      fVar8 = xm_amiga_period((fVar8 - fVar10) / (float)(int)(unaff_R15D - (int)unaff_EBP) +
                              (float)((char)bVar2 + 2) * 12.0 + fVar6 + fVar9);
      fVar8 = fVar7 * 16.0 + fVar8;
    }
    fVar5 = (float)(~-(uint)(fVar8 == 0.0) & (uint)(7093789.0 / (fVar8 + fVar8)));
  }
  else {
    fVar5 = 0.0;
    if (xVar1 == XM_LINEAR_FREQUENCIES) {
      fVar5 = exp2f((4608.0 - (fVar7 * -16.0 + fVar9 * -64.0 + fVar8)) / 768.0);
      fVar5 = fVar5 * 8363.0;
    }
  }
  ch->frequency = fVar5;
  ch->step = fVar5 / (float)ctx->rate;
  return;
}

Assistant:

static void xm_update_frequency(xm_context_t* ctx, xm_channel_context_t* ch) {
	ch->frequency = xm_frequency(
		ctx, ch->period,
		ch->arp_note_offset,
		ch->vibrato_note_offset + ch->autovibrato_note_offset
	);
	ch->step = ch->frequency / ctx->rate;
}